

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O0

node_t * __thiscall
expression_tree::node<int,_expression_tree::cache_on_assignment,_expression_tree::sequential>::
operator=(node<int,_expression_tree::cache_on_assignment,_expression_tree::sequential> *this,int *t)

{
  leaf<int> *this_00;
  int *t_local;
  node<int,_expression_tree::cache_on_assignment,_expression_tree::sequential> *this_local;
  
  this_00 = (leaf<int> *)operator_new(0x10);
  detail::leaf<int>::leaf(this_00,t);
  std::
  unique_ptr<expression_tree::detail::node_impl<int>,_std::default_delete<expression_tree::detail::node_impl<int>_>_>
  ::reset(&this->impl,(pointer)this_00);
  if (this->parent != (node_t *)0x0) {
    modified(this->parent);
  }
  return this;
}

Assistant:

node_t& operator=(const T& t)
	{
		impl.reset(new detail::leaf<T>(t));

		if(parent)
		{
			parent->modified();
		}

		return *this;
	}